

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadArgumentElimination.cpp
# Opt level: O2

void __thiscall wasm::DAE::~DAE(DAE *this)

{
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__DAE_00e1dfa0;
  std::
  _Hashtable<wasm::Call_*,_std::pair<wasm::Call_*const,_wasm::Expression_**>,_std::allocator<std::pair<wasm::Call_*const,_wasm::Expression_**>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Call_*>,_std::hash<wasm::Call_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->allDroppedCalls)._M_h);
  Pass::~Pass(&this->super_Pass);
  return;
}

Assistant:

bool invalidatesDWARF() override { return true; }